

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

int32_t __thiscall fasttext::FastText::getSubwordId(FastText *this,string *subword)

{
  uint uVar1;
  uint32_t uVar2;
  int32_t iVar3;
  string_view str;
  
  str._M_str = (subword->_M_dataplus)._M_p;
  str._M_len = subword->_M_string_length;
  uVar2 = Dictionary::hash((this->dict_).
                           super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,str);
  uVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          bucket;
  iVar3 = Dictionary::nwords((this->dict_).
                             super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  return iVar3 + uVar2 % uVar1;
}

Assistant:

int32_t FastText::getSubwordId(const std::string& subword) const {
  int32_t h = dict_->hash(subword) % args_->bucket;
  return dict_->nwords() + h;
}